

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

void Cec_ManStartSimInfo(Vec_Ptr_t *vInfo,int nFlops)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  int iVar5;
  int i;
  
  uVar1 = Vec_PtrReadWordsSimInfo(vInfo);
  if (nFlops <= vInfo->nSize) {
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    i = 0;
    iVar5 = 0;
    if (0 < nFlops) {
      i = 0;
      iVar5 = nFlops;
    }
    for (; i != iVar5; i = i + 1) {
      pvVar3 = Vec_PtrEntry(vInfo,i);
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        *(undefined4 *)((long)pvVar3 + uVar4 * 4) = 0;
      }
    }
    for (; nFlops < vInfo->nSize; nFlops = nFlops + 1) {
      pvVar3 = Vec_PtrEntry(vInfo,nFlops);
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        uVar2 = Gia_ManRandom(0);
        *(uint *)((long)pvVar3 + uVar4 * 4) = uVar2;
      }
    }
    return;
  }
  __assert_fail("nFlops <= Vec_PtrSize(vInfo)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                ,0x129,"void Cec_ManStartSimInfo(Vec_Ptr_t *, int)");
}

Assistant:

void Cec_ManStartSimInfo( Vec_Ptr_t * vInfo, int nFlops )
{
    unsigned * pInfo;
    int k, w, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    assert( nFlops <= Vec_PtrSize(vInfo) );
    for ( k = 0; k < nFlops; k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    for ( k = nFlops; k < Vec_PtrSize(vInfo); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom( 0 );
    }
}